

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O3

void __thiscall SemanticTypes::visit(SemanticTypes *this,AssignNode *assignNode)

{
  ExpNode *pEVar1;
  bool bVar2;
  
  pEVar1 = assignNode->exp1;
  if (pEVar1 == (ExpNode *)0x0) {
    visit((SemanticTypes *)assignNode);
  }
  else {
    (*(pEVar1->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar1,this);
    pEVar1 = assignNode->exp2;
    if (pEVar1 == (ExpNode *)0x0) {
      visit((SemanticTypes *)assignNode);
    }
    else {
      (*(pEVar1->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar1,this);
      pEVar1 = assignNode->exp1;
      bVar2 = _match_exp_types(pEVar1,assignNode->exp2);
      if (bVar2) {
        if (pEVar1->lValue == false) {
          visit((SemanticTypes *)pEVar1);
        }
        else {
          (assignNode->super_ExpNode).type = pEVar1->type;
          (assignNode->super_ExpNode).pointer = pEVar1->pointer;
          (assignNode->super_ExpNode).lValue = false;
        }
      }
      else {
        visit((SemanticTypes *)assignNode);
      }
    }
  }
  return;
}

Assistant:

void SemanticTypes::visit(AssignNode *assignNode) {
    if (assignNode->getExp1())
        assignNode->getExp1()->accept(this);
    else {
        fprintf(stderr,
                "[SEMANTIC ERROR - assignNode] NO EXPRESSION TO BE ASSIGNED, line: %d\n",
                assignNode->getLine());
        return;
    }

    if (assignNode->getExp2())
        assignNode->getExp2()->accept(this);
    else {
        fprintf(stderr,
                "[SEMANTIC ERROR - assignNode] NO EXPRESSION TO ASSIGN, line: %d\n",
                assignNode->getLine());
        return;
    }


    if (!_match_exp_types(assignNode->getExp1(), assignNode->getExp2())) {
        fprintf(stderr,
                "[SEMANTIC ERROR - assignNode] CANNOT ASSIGN AN EXPRESSION TO A DIFFERENT TYPE, line: %d\n",
                assignNode->getLine());
        return;
    }

    if (!assignNode->getExp1()->isLValue()) {
        fprintf(stderr,
                "[SEMANTIC ERROR - assignNode] LVALUE EXPECTED, line: %d expected: %s got: %s\n",
                assignNode->getExp1()->getLine(), assignNode->getExp1()->getTypeLexeme(),
                assignNode->getExp1()->getTypeLexeme());
        return;
    }

    assignNode->setType(assignNode->getExp1()->getType());
    assignNode->setTypeLexeme(assignNode->getTypeLexeme());
    assignNode->setArraySize(assignNode->getArraySize());
    assignNode->setPointer(assignNode->getExp1()->isPointer());
    assignNode->setLValue(false);
    
}